

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::get_options
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  Display DVar1;
  pointer pOVar2;
  long in_RSI;
  unique_ptr<PCCompatible::Machine::Options,_std::default_delete<PCCompatible::Machine::Options>_>
  local_20;
  __single_object options;
  ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this_local;
  
  std::make_unique<PCCompatible::Machine::Options,Configurable::OptionsType>
            ((OptionsType *)&local_20);
  DVar1 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0xe8))
  ;
  pOVar2 = std::
           unique_ptr<PCCompatible::Machine::Options,_std::default_delete<PCCompatible::Machine::Options>_>
           ::operator->(&local_20);
  (pOVar2->super_DisplayOption<PCCompatible::Machine::Options>).output = DVar1;
  std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
  unique_ptr<PCCompatible::Machine::Options,std::default_delete<PCCompatible::Machine::Options>,void>
            ((unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)this,
             &local_20);
  std::
  unique_ptr<PCCompatible::Machine::Options,_std::default_delete<PCCompatible::Machine::Options>_>::
  ~unique_ptr(&local_20);
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			return options;
		}